

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

int __thiscall
CGraphics_Threaded::LoadPNG
          (CGraphics_Threaded *this,CImageInfo *pImg,char *pFilename,int StorageType)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  uchar *data;
  undefined4 in_register_0000000c;
  int iVar3;
  char *fmt;
  long in_FS_OFFSET;
  png_t Png;
  char aCompleteFilename [512];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 1;
  iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,pFilename,1,CONCAT44(in_register_0000000c,StorageType),
                     aCompleteFilename,0x200,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
  if (io == (IOHANDLE)0x0) {
    iVar2 = 0;
    dbg_msg("game/png","failed to open file. filename=\'%s\'",pFilename);
    goto LAB_0011f179;
  }
  png_init((png_alloc_t)0x0,(png_free_t)0x0);
  iVar2 = png_open_read(&Png,(png_read_callback_t)0x0,io);
  if (iVar2 == 0) {
    if ((Png.depth == '\b') &&
       ((Png.height < 0x2001 && Png.width < 0x2001) && (Png.color_type & 0xfb) == 2)) {
      data = (uchar *)mem_alloc((uint)Png.bpp * Png.height * Png.width);
      png_get_data(&Png,data);
      io_close(io);
      pImg->m_Width = Png.width;
      pImg->m_Height = Png.height;
      if (Png.color_type == '\x02') {
        iVar3 = 0;
LAB_0011f1e7:
        pImg->m_Format = iVar3;
      }
      else if (Png.color_type == '\x06') goto LAB_0011f1e7;
      pImg->m_pData = data;
      iVar2 = 1;
      goto LAB_0011f179;
    }
    fmt = "invalid format. filename=\'%s\'";
  }
  else {
    fmt = "failed to read file. filename=\'%s\'";
  }
  iVar2 = 0;
  dbg_msg("game/png",fmt,aCompleteFilename);
  io_close(io);
LAB_0011f179:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int CGraphics_Threaded::LoadPNG(CImageInfo *pImg, const char *pFilename, int StorageType)
{
	// open file for reading
	char aCompleteFilename[IO_MAX_PATH_LENGTH];
	IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, StorageType, aCompleteFilename, sizeof(aCompleteFilename));
	if(!File)
	{
		dbg_msg("game/png", "failed to open file. filename='%s'", pFilename);
		return 0;
	}

	png_init(0, 0); // ignore_convention
	png_t Png; // ignore_convention
	int Error = png_open_read(&Png, 0, File); // ignore_convention
	if(Error != PNG_NO_ERROR)
	{
		dbg_msg("game/png", "failed to read file. filename='%s'", aCompleteFilename);
		io_close(File);
		return 0;
	}

	if(Png.depth != 8 || (Png.color_type != PNG_TRUECOLOR && Png.color_type != PNG_TRUECOLOR_ALPHA) || Png.width > (2<<12) || Png.height > (2<<12)) // ignore_convention
	{
		dbg_msg("game/png", "invalid format. filename='%s'", aCompleteFilename);
		io_close(File);
		return 0;
	}

	unsigned char *pBuffer = (unsigned char *)mem_alloc(Png.width * Png.height * Png.bpp); // ignore_convention
	png_get_data(&Png, pBuffer); // ignore_convention
	io_close(File);

	pImg->m_Width = Png.width; // ignore_convention
	pImg->m_Height = Png.height; // ignore_convention
	if(Png.color_type == PNG_TRUECOLOR) // ignore_convention
		pImg->m_Format = CImageInfo::FORMAT_RGB;
	else if(Png.color_type == PNG_TRUECOLOR_ALPHA) // ignore_convention
		pImg->m_Format = CImageInfo::FORMAT_RGBA;
	pImg->m_pData = pBuffer;
	return 1;
}